

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_load_from_memory
              (plugin_manager manager,plugin p,loader_impl impl,char *buffer,size_t size,
              void **handle_ptr)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  char *path;
  loader_impl impl_00;
  loader_handle_impl handle_impl_00;
  char *pcVar4;
  undefined8 *puVar5;
  long in_RCX;
  long in_RDX;
  plugin in_RSI;
  long in_R8;
  loader_handle_impl iterator_handle_impl_1;
  size_t iterator_1;
  loader_handle_impl iterator_handle_impl;
  size_t iterator;
  loader_handle_impl handle_impl;
  size_t init_order;
  loader_handle handle;
  loader_name name;
  loader_impl_interface iface;
  loader_impl in_stack_fffffffffffffe68;
  vector in_stack_fffffffffffffe70;
  loader_handle in_stack_fffffffffffffe78;
  loader_impl_interface in_stack_fffffffffffffe80;
  loader_impl in_stack_fffffffffffffe88;
  loader_handle_impl in_stack_fffffffffffffe90;
  loader_impl in_stack_fffffffffffffe98;
  char *pcVar6;
  plugin_manager in_stack_fffffffffffffeb8;
  loader_impl in_stack_fffffffffffffed8;
  plugin in_stack_fffffffffffffee0;
  plugin_manager in_stack_fffffffffffffee8;
  
  if ((((in_RDX != 0) && (in_RCX != 0)) && (in_R8 != 0)) &&
     (pvVar2 = plugin_iface(in_RSI), pvVar2 != (void *)0x0)) {
    iVar1 = loader_impl_initialize
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8
                      );
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = loader_impl_load_from_memory_name
                      (in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90,
                       (char *)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
    if (iVar1 != 0) {
      log_write_impl_va("metacall",0x3f9,"loader_impl_load_from_memory",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                        ,LOG_LEVEL_ERROR,
                        "Load from memory handle failed, name could not be generated correctly");
      return 1;
    }
    pvVar3 = loader_impl_get_handle(in_stack_fffffffffffffe68,(char *)0x13176a);
    if (pvVar3 != (void *)0x0) {
      log_write_impl_va("metacall",0x400,"loader_impl_load_from_memory",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                        ,LOG_LEVEL_ERROR,
                        "Load from memory handle failed, handle with name %s already loaded",
                        &stack0xfffffffffffffeb8);
      return 1;
    }
    path = (char *)vector_size(*(vector *)(in_RDX + 0x20));
    vector_push_back_empty((vector)0x1317de);
    impl_00 = (loader_impl)
              (**(code **)((long)pvVar2 + 0x18))(in_RDX,&stack0xfffffffffffffeb8,in_RCX,in_R8);
    if (impl_00 == (loader_impl)0x0) {
      while( true ) {
        pcVar6 = path + 1;
        path = pcVar6;
        pcVar4 = (char *)vector_size(*(vector *)(in_RDX + 0x20));
        if (pcVar4 <= pcVar6) break;
        vector_at((vector)in_stack_fffffffffffffe68,0x131a83);
        loader_impl_destroy_handle(in_stack_fffffffffffffe90);
      }
      vector_pop_back((vector)0x131ab6);
    }
    else {
      handle_impl_00 =
           loader_impl_load_handle
                     (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                      (char *)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
      if (handle_impl_00 != (loader_handle_impl)0x0) {
        handle_impl_00->populated = 1;
        iVar1 = set_insert((set)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                           in_stack_fffffffffffffe88);
        if (iVar1 == 0) {
          iVar1 = set_insert((set)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                             in_stack_fffffffffffffe88);
          if (iVar1 == 0) {
            iVar1 = (**(code **)((long)pvVar2 + 0x30))
                              (in_RDX,handle_impl_00->module,handle_impl_00->ctx);
            if ((iVar1 == 0) &&
               (iVar1 = loader_impl_handle_register
                                  (in_stack_fffffffffffffeb8,impl_00,path,handle_impl_00,
                                   &in_stack_fffffffffffffe98->p), iVar1 == 0)) {
              vector_set(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,
                         (void *)0x13192c);
              return 0;
            }
            set_remove((set)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
          }
          set_remove((set)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        }
        while( true ) {
          pcVar6 = path + 1;
          path = pcVar6;
          pcVar4 = (char *)vector_size(*(vector *)(in_RDX + 0x20));
          if (pcVar4 <= pcVar6) break;
          puVar5 = (undefined8 *)vector_at((vector)in_stack_fffffffffffffe68,0x1319c1);
          in_stack_fffffffffffffe90 = (loader_handle_impl)*puVar5;
          loader_impl_destroy_handle(in_stack_fffffffffffffe90);
        }
        vector_pop_back((vector)0x1319f4);
        log_write_impl_va("metacall",0x437,"loader_impl_load_from_memory",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                          ,LOG_LEVEL_ERROR,"Error when loading handle: %s",&stack0xfffffffffffffeb8)
        ;
        loader_impl_destroy_handle(in_stack_fffffffffffffe90);
      }
    }
  }
  return 1;
}

Assistant:

int loader_impl_load_from_memory(plugin_manager manager, plugin p, loader_impl impl, const char *buffer, size_t size, void **handle_ptr)
{
	if (impl != NULL && buffer != NULL && size > 0)
	{
		loader_impl_interface iface = loader_iface(p);

		/* TODO: Disable logs here until log is completely thread safe and async signal safe */
		/* log_write("metacall", LOG_LEVEL_DEBUG, "Loading from memory %.10s...", buffer); */

		if (iface != NULL)
		{
			loader_name name;
			loader_handle handle = NULL;
			size_t init_order;

			if (loader_impl_initialize(manager, p, impl) != 0)
			{
				return 1;
			}

			if (loader_impl_load_from_memory_name(impl, name, buffer, size) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Load from memory handle failed, name could not be generated correctly");

				return 1;
			}

			if (loader_impl_get_handle(impl, name) != NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Load from memory handle failed, handle with name %s already loaded", name);

				return 1;
			}

			init_order = vector_size(impl->handle_impl_init_order);

			vector_push_back_empty(impl->handle_impl_init_order);

			handle = iface->load_from_memory(impl, name, buffer, size);

			/* TODO: Disable logs here until log is completely thread safe and async signal safe */
			/* log_write("metacall", LOG_LEVEL_DEBUG, "Loader interface: %p - Loader handle: %p", (void *)iface, (void *)handle); */

			if (handle != NULL)
			{
				loader_handle_impl handle_impl = loader_impl_load_handle(impl, iface, handle, name, LOADER_NAME_SIZE);

				if (handle_impl != NULL)
				{
					handle_impl->populated = 1;

					if (set_insert(impl->handle_impl_path_map, handle_impl->path, handle_impl) == 0)
					{
						if (set_insert(impl->handle_impl_map, handle_impl->module, handle_impl) == 0)
						{
							if (iface->discover(impl, handle_impl->module, handle_impl->ctx) == 0)
							{
								if (loader_impl_handle_register(manager, impl, name, handle_impl, handle_ptr) == 0)
								{
									vector_set_var(impl->handle_impl_init_order, init_order, handle_impl);

									return 0;
								}
							}

							set_remove(impl->handle_impl_map, handle_impl->module);
						}

						set_remove(impl->handle_impl_path_map, handle_impl->path);
					}

					{
						size_t iterator;

						for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
						{
							loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

							loader_impl_destroy_handle(iterator_handle_impl);
						}

						vector_pop_back(impl->handle_impl_init_order);
					}

					log_write("metacall", LOG_LEVEL_ERROR, "Error when loading handle: %s", name);

					loader_impl_destroy_handle(handle_impl);
				}
			}
			else
			{
				size_t iterator;

				for (iterator = init_order + 1; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
				{
					loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

					loader_impl_destroy_handle(iterator_handle_impl);
				}

				vector_pop_back(impl->handle_impl_init_order);
			}
		}
	}

	return 1;
}